

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall Config::Load(Config *this)

{
  FILE *__stream;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDI;
  FileReadStream inputStream;
  char buffer [65536];
  FILE *fp;
  FileReadStream *in_stack_fffffffffffeff98;
  FILE *in_stack_fffffffffffeffa8;
  FileReadStream *in_stack_fffffffffffeffb0;
  
  __stream = fopen((char *)in_RDI[1].
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           .data_.n,"r");
  if (__stream != (FILE *)0x0) {
    rapidjson::FileReadStream::FileReadStream
              (in_stack_fffffffffffeffb0,in_stack_fffffffffffeffa8,(char *)in_RDI,
               (size_t)in_stack_fffffffffffeff98);
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::ParseStream<rapidjson::FileReadStream>(in_RDI,in_stack_fffffffffffeff98);
    fclose(__stream);
    in_RDI[1].
    super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
    .data_.ss.str[8] = '\x01';
  }
  return;
}

Assistant:

void Config::Load()
{
    FILE* fp = fopen(_FilePath,"r");
    if (fp == NULL)
        return;
    char buffer[65536];
    rapidjson::FileReadStream inputStream(fp,buffer, sizeof(buffer));
    Settings.ParseStream(inputStream);
    fclose(fp);
    loaded = true;
}